

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

int __thiscall fmt::File::dup2(File *this,int __fd,int __fd2)

{
  int iVar1;
  int *piVar2;
  SystemError *this_00;
  int fd_local;
  
  do {
    iVar1 = ::dup2(this->fd_,__fd);
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  SystemError::SystemError<int,int>(this_00,*piVar2,(CStringRef)0x2c46b4,&this->fd_,&fd_local);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

void fmt::File::dup2(int fd) {
  int result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(dup2(fd_, fd)));
  if (result == -1) {
    FMT_THROW(SystemError(errno,
      "cannot duplicate file descriptor {} to {}", fd_, fd));
  }
}